

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sp800_56b_gen.c
# Opt level: O0

int ossl_rsa_sp800_56b_derive_params_from_pq(RSA *rsa,int nbits,BIGNUM *e,BN_CTX *ctx)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  BIGNUM *b;
  BIGNUM *b_00;
  BIGNUM *b_01;
  BIGNUM *b_02;
  BIGNUM *b_03;
  BIGNUM *pBVar9;
  BIGNUM *pBVar10;
  BN_CTX *in_RCX;
  BIGNUM *in_RDX;
  int in_ESI;
  BIGNUM *in_RDI;
  BIGNUM *gcd;
  BIGNUM *p1q1;
  BIGNUM *lcm;
  BIGNUM *q1;
  BIGNUM *p1;
  int ret;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar11;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar11 = -1;
  BN_CTX_start((BN_CTX *)in_RCX);
  b = BN_CTX_get((BN_CTX *)in_RCX);
  b_00 = BN_CTX_get((BN_CTX *)in_RCX);
  b_01 = BN_CTX_get((BN_CTX *)in_RCX);
  b_02 = BN_CTX_get((BN_CTX *)in_RCX);
  b_03 = BN_CTX_get((BN_CTX *)in_RCX);
  if (b_03 != (BIGNUM *)0x0) {
    BN_set_flags((BIGNUM *)b,4);
    BN_set_flags((BIGNUM *)b_00,4);
    BN_set_flags((BIGNUM *)b_01,4);
    BN_set_flags((BIGNUM *)b_02,4);
    BN_set_flags((BIGNUM *)b_03,4);
    iVar8 = ossl_rsa_get_lcm(in_RCX,(BIGNUM *)CONCAT44(iVar11,in_stack_ffffffffffffffd8),(BIGNUM *)b
                             ,(BIGNUM *)b_00,(BIGNUM *)b_01,(BIGNUM *)b_02,
                             (BIGNUM *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
    if (iVar8 == 1) {
      BN_free((BIGNUM *)in_RDI[2].d);
      pBVar9 = BN_dup(in_RDX);
      in_RDI[2].d = (unsigned_long *)pBVar9;
      if (in_RDI[2].d != (unsigned_long *)0x0) {
        BN_clear_free(*(BIGNUM **)&in_RDI[2].top);
        pBVar10 = BN_secure_new();
        *(BIGNUM **)&in_RDI[2].top = pBVar10;
        lVar1._0_4_ = in_RDI[2].top;
        lVar1._4_4_ = in_RDI[2].dmax;
        if (lVar1 != 0) {
          BN_set_flags(*(BIGNUM **)&in_RDI[2].top,4);
          pBVar9 = BN_mod_inverse(*(BIGNUM **)&in_RDI[2].top,in_RDX,b_01,(BN_CTX *)in_RCX);
          if (pBVar9 != (BIGNUM *)0x0) {
            iVar8 = BN_num_bits(*(BIGNUM **)&in_RDI[2].top);
            if (in_ESI >> 1 < iVar8) {
              lVar2._0_4_ = in_RDI[1].neg;
              lVar2._4_4_ = in_RDI[1].flags;
              if (lVar2 == 0) {
                pBVar9 = BN_new();
                *(BIGNUM **)&in_RDI[1].neg = pBVar9;
              }
              lVar3._0_4_ = in_RDI[1].neg;
              lVar3._4_4_ = in_RDI[1].flags;
              if ((lVar3 != 0) &&
                 (iVar8 = BN_mul(*(BIGNUM **)&in_RDI[1].neg,*(BIGNUM **)&in_RDI[2].neg,
                                 (BIGNUM *)in_RDI[3].d,(BN_CTX *)in_RCX), iVar8 != 0)) {
                lVar4._0_4_ = in_RDI[3].top;
                lVar4._4_4_ = in_RDI[3].dmax;
                if (lVar4 == 0) {
                  pBVar10 = BN_secure_new();
                  *(BIGNUM **)&in_RDI[3].top = pBVar10;
                }
                lVar5._0_4_ = in_RDI[3].top;
                lVar5._4_4_ = in_RDI[3].dmax;
                if (lVar5 != 0) {
                  BN_set_flags(*(BIGNUM **)&in_RDI[3].top,4);
                  iVar8 = BN_div((BIGNUM *)0x0,*(BIGNUM **)&in_RDI[3].top,*(BIGNUM **)&in_RDI[2].top
                                 ,b,(BN_CTX *)in_RCX);
                  if (iVar8 != 0) {
                    lVar6._0_4_ = in_RDI[3].neg;
                    lVar6._4_4_ = in_RDI[3].flags;
                    if (lVar6 == 0) {
                      pBVar10 = BN_secure_new();
                      *(BIGNUM **)&in_RDI[3].neg = pBVar10;
                    }
                    lVar7._0_4_ = in_RDI[3].neg;
                    lVar7._4_4_ = in_RDI[3].flags;
                    if (lVar7 != 0) {
                      BN_set_flags(*(BIGNUM **)&in_RDI[3].neg,4);
                      iVar8 = BN_div((BIGNUM *)0x0,*(BIGNUM **)&in_RDI[3].neg,
                                     *(BIGNUM **)&in_RDI[2].top,b_00,(BN_CTX *)in_RCX);
                      if (iVar8 != 0) {
                        BN_free((BIGNUM *)in_RDI[4].d);
                        pBVar10 = BN_secure_new();
                        in_RDI[4].d = (unsigned_long *)pBVar10;
                        if (in_RDI[4].d != (unsigned_long *)0x0) {
                          BN_set_flags((BIGNUM *)in_RDI[4].d,4);
                          pBVar9 = BN_mod_inverse((BIGNUM *)in_RDI[4].d,(BIGNUM *)in_RDI[3].d,
                                                  *(BIGNUM **)&in_RDI[2].neg,(BN_CTX *)in_RCX);
                          if (pBVar9 != (BIGNUM *)0x0) {
                            *(int *)&in_RDI[9].d = *(int *)&in_RDI[9].d + 1;
                            iVar11 = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar11 = 0;
            }
          }
        }
      }
    }
  }
  if (iVar11 != 1) {
    BN_free((BIGNUM *)in_RDI[2].d);
    in_RDI[2].d = (unsigned_long *)0x0;
    BN_free(*(BIGNUM **)&in_RDI[2].top);
    in_RDI[2].top = 0;
    in_RDI[2].dmax = 0;
    BN_free(*(BIGNUM **)&in_RDI[1].neg);
    in_RDI[1].neg = 0;
    in_RDI[1].flags = 0;
    BN_free((BIGNUM *)in_RDI[4].d);
    in_RDI[4].d = (unsigned_long *)0x0;
    BN_free(*(BIGNUM **)&in_RDI[3].neg);
    in_RDI[3].neg = 0;
    in_RDI[3].flags = 0;
    BN_free(*(BIGNUM **)&in_RDI[3].top);
    in_RDI[3].top = 0;
    in_RDI[3].dmax = 0;
  }
  BN_clear(b);
  BN_clear(b_00);
  BN_clear(b_01);
  BN_clear(b_02);
  BN_clear(b_03);
  BN_CTX_end((BN_CTX *)in_RCX);
  return iVar11;
}

Assistant:

int ossl_rsa_sp800_56b_derive_params_from_pq(RSA *rsa, int nbits,
                                             const BIGNUM *e, BN_CTX *ctx)
{
    int ret = -1;
    BIGNUM *p1, *q1, *lcm, *p1q1, *gcd;

    BN_CTX_start(ctx);
    p1 = BN_CTX_get(ctx);
    q1 = BN_CTX_get(ctx);
    lcm = BN_CTX_get(ctx);
    p1q1 = BN_CTX_get(ctx);
    gcd = BN_CTX_get(ctx);
    if (gcd == NULL)
        goto err;

    BN_set_flags(p1, BN_FLG_CONSTTIME);
    BN_set_flags(q1, BN_FLG_CONSTTIME);
    BN_set_flags(lcm, BN_FLG_CONSTTIME);
    BN_set_flags(p1q1, BN_FLG_CONSTTIME);
    BN_set_flags(gcd, BN_FLG_CONSTTIME);

    /* LCM((p-1, q-1)) */
    if (ossl_rsa_get_lcm(ctx, rsa->p, rsa->q, lcm, gcd, p1, q1, p1q1) != 1)
        goto err;

    /* copy e */
    BN_free(rsa->e);
    rsa->e = BN_dup(e);
    if (rsa->e == NULL)
        goto err;

    BN_clear_free(rsa->d);
    /* (Step 3) d = (e^-1) mod (LCM(p-1, q-1)) */
    rsa->d = BN_secure_new();
    if (rsa->d == NULL)
        goto err;
    BN_set_flags(rsa->d, BN_FLG_CONSTTIME);
    if (BN_mod_inverse(rsa->d, e, lcm, ctx) == NULL)
        goto err;

    /* (Step 3) return an error if d is too small */
    if (BN_num_bits(rsa->d) <= (nbits >> 1)) {
        ret = 0;
        goto err;
    }

    /* (Step 4) n = pq */
    if (rsa->n == NULL)
        rsa->n = BN_new();
    if (rsa->n == NULL || !BN_mul(rsa->n, rsa->p, rsa->q, ctx))
        goto err;

    /* (Step 5a) dP = d mod (p-1) */
    if (rsa->dmp1 == NULL)
        rsa->dmp1 = BN_secure_new();
    if (rsa->dmp1 == NULL)
        goto err;
    BN_set_flags(rsa->dmp1, BN_FLG_CONSTTIME);
    if (!BN_mod(rsa->dmp1, rsa->d, p1, ctx))
        goto err;

    /* (Step 5b) dQ = d mod (q-1) */
    if (rsa->dmq1 == NULL)
        rsa->dmq1 = BN_secure_new();
    if (rsa->dmq1 == NULL)
        goto err;
    BN_set_flags(rsa->dmq1, BN_FLG_CONSTTIME);
    if (!BN_mod(rsa->dmq1, rsa->d, q1, ctx))
        goto err;

    /* (Step 5c) qInv = (inverse of q) mod p */
    BN_free(rsa->iqmp);
    rsa->iqmp = BN_secure_new();
    if (rsa->iqmp == NULL)
        goto err;
    BN_set_flags(rsa->iqmp, BN_FLG_CONSTTIME);
    if (BN_mod_inverse(rsa->iqmp, rsa->q, rsa->p, ctx) == NULL)
        goto err;

    rsa->dirty_cnt++;
    ret = 1;
err:
    if (ret != 1) {
        BN_free(rsa->e);
        rsa->e = NULL;
        BN_free(rsa->d);
        rsa->d = NULL;
        BN_free(rsa->n);
        rsa->n = NULL;
        BN_free(rsa->iqmp);
        rsa->iqmp = NULL;
        BN_free(rsa->dmq1);
        rsa->dmq1 = NULL;
        BN_free(rsa->dmp1);
        rsa->dmp1 = NULL;
    }
    BN_clear(p1);
    BN_clear(q1);
    BN_clear(lcm);
    BN_clear(p1q1);
    BN_clear(gcd);

    BN_CTX_end(ctx);
    return ret;
}